

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.h
# Opt level: O0

void __thiscall ForStatement::execute(ForStatement *this,Environment *env)

{
  bool bVar1;
  element_type *peVar2;
  RuntimeException *this_00;
  element_type *peVar3;
  element_type *peVar4;
  BreakPacket *anon_var_0;
  ContinuePacket *anon_var_0_1;
  ptr<Value> newValue;
  Environment local;
  undefined1 local_60 [8];
  Iterator iterator;
  undefined1 local_38 [8];
  ptr<Iterable> iterable;
  ptr<Value> expressionResult;
  Environment *env_local;
  ForStatement *this_local;
  
  peVar2 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->expression);
  (**peVar2->_vptr_Expression)
            (&iterable.super___shared_ptr<Iterable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,peVar2,
             env);
  std::dynamic_pointer_cast<Iterable,Value>((shared_ptr<Value> *)local_38);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (!bVar1) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x10);
    RuntimeException::RuntimeException(this_00,"Given value is not an iterable");
    __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  peVar3 = std::__shared_ptr_access<Iterable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Iterable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_38);
  (**peVar3->_vptr_Iterable)(&local.symbols._M_h._M_single_bucket);
  Iterator::Iterator((Iterator *)local_60,(ptr<ValueList> *)&local.symbols._M_h._M_single_bucket);
  std::shared_ptr<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>_>::
  ~shared_ptr((shared_ptr<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>_>
               *)&local.symbols._M_h._M_single_bucket);
  while( true ) {
    bVar1 = Iterator::hasNext((Iterator *)local_60);
    if (!bVar1) break;
    Environment::Environment
              ((Environment *)
               &newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,env);
    Iterator::next((Iterator *)&stack0xffffffffffffff48);
    std::shared_ptr<Value>::shared_ptr
              ((shared_ptr<Value> *)&anon_var_0_1,(shared_ptr<Value> *)&stack0xffffffffffffff48);
    Environment::putValue
              ((Environment *)
               &newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &this->ident,Public,(shared_ptr<Value> *)&anon_var_0_1,false);
    std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)&anon_var_0_1);
    peVar4 = std::__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->statementBlock);
    (**(peVar4->super_Statement)._vptr_Statement)
              (peVar4,&newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)&stack0xffffffffffffff48);
    Environment::~Environment
              ((Environment *)
               &newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  Iterator::~Iterator((Iterator *)local_60);
  std::shared_ptr<Iterable>::~shared_ptr((shared_ptr<Iterable> *)local_38);
  std::shared_ptr<Value>::~shared_ptr
            ((shared_ptr<Value> *)
             &iterable.super___shared_ptr<Iterable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> expressionResult = expression->evaluate(env);
        ptr<Iterable> iterable = std::dynamic_pointer_cast<Iterable>(expressionResult);

        if(!iterable)
            throw RuntimeException("Given value is not an iterable");

        Iterator iterator(iterable -> getValues());

        while(iterator.hasNext()) {
            try {
                Environment local = *env;
                ptr<Value> newValue = iterator.next();
                local.putValue(ident, Scope::Public, newValue, false);
                statementBlock -> execute(&local);
            } catch (BreakPacket&) {
                break;
            } catch (ContinuePacket&) { }
        }
    }